

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.hpp
# Opt level: O2

void __thiscall
duckdb::ArrowExtensionMetadata::ArrowExtensionMetadata
          (ArrowExtensionMetadata *this,ArrowExtensionMetadata *param_1)

{
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  ::std::__cxx11::string::string((string *)&this->vendor_name,(string *)&param_1->vendor_name);
  ::std::__cxx11::string::string((string *)&this->type_name,(string *)&param_1->type_name);
  ::std::__cxx11::string::string((string *)&this->arrow_format,(string *)&param_1->arrow_format);
  return;
}

Assistant:

ArrowExtensionMetadata() {
	}